

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O2

void __thiscall
FIX::HttpConnection::processRefreshSession
          (HttpConnection *this,HttpMessage *request,stringstream *h,stringstream *b)

{
  bool bVar1;
  string *psVar2;
  Session *pSVar3;
  ostream *poVar4;
  TAG *pTVar5;
  ostream *poVar6;
  SessionNotFound *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_808;
  string local_7e8;
  string local_7c8;
  string sessionUrl;
  string sessionQualifier;
  string targetCompID;
  string senderCompID;
  string beginString;
  HttpMessage copy;
  CENTER center;
  H2 h2;
  A a;
  SessionID sessionID;
  
  HttpMessage::HttpMessage(&copy,request);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"BeginString",(allocator<char> *)&h2);
  psVar2 = HttpMessage::getParameter(request,(string *)&center);
  std::__cxx11::string::string((string *)&beginString,(string *)psVar2);
  std::__cxx11::string::~string((string *)&center);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"SenderCompID",(allocator<char> *)&h2);
  psVar2 = HttpMessage::getParameter(request,(string *)&center);
  std::__cxx11::string::string((string *)&senderCompID,(string *)psVar2);
  std::__cxx11::string::~string((string *)&center);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"TargetCompID",(allocator<char> *)&h2);
  psVar2 = HttpMessage::getParameter(request,(string *)&center);
  std::__cxx11::string::string((string *)&targetCompID,(string *)psVar2);
  std::__cxx11::string::~string((string *)&center);
  sessionQualifier._M_dataplus._M_p = (pointer)&sessionQualifier.field_2;
  sessionQualifier._M_string_length = 0;
  sessionQualifier.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"SessionQualifier",(allocator<char> *)&h2);
  bVar1 = HttpMessage::hasParameter(&copy,(string *)&center);
  std::__cxx11::string::~string((string *)&center);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&center,"SessionQualifier",(allocator<char> *)&h2);
    HttpMessage::getParameter(&copy,(string *)&center);
    std::__cxx11::string::_M_assign((string *)&sessionQualifier);
    std::__cxx11::string::~string((string *)&center);
  }
  SessionID::SessionID(&sessionID,&beginString,&senderCompID,&targetCompID,&sessionQualifier);
  pSVar3 = Session::lookupSession(&sessionID);
  if (pSVar3 == (Session *)0x0) {
    this_00 = (SessionNotFound *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>((string *)&center,"",(allocator<char> *)&h2);
    SessionNotFound::SessionNotFound(this_00,(string *)&center);
    __cxa_throw(this_00,&SessionNotFound::typeinfo,Exception::~Exception);
  }
  HttpMessage::getParameterString_abi_cxx11_((string *)&center,request);
  std::operator+(&sessionUrl,"/session",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&center);
  std::__cxx11::string::~string((string *)&center);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"confirm",(allocator<char> *)&a);
  bVar1 = HttpMessage::hasParameter(&copy,(string *)&center);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&h2,"confirm",(allocator<char> *)&bStack_808);
    psVar2 = HttpMessage::getParameter(&copy,(string *)&h2);
    bVar1 = std::operator!=(psVar2,"0");
    std::__cxx11::string::~string((string *)&h2);
    std::__cxx11::string::~string((string *)&center);
    if (bVar1) {
      SessionState::refresh(&pSVar3->m_state);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&center,"confirm",(allocator<char> *)&h2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::erase(&copy.m_parameters._M_t,(key_type *)&center);
      std::__cxx11::string::~string((string *)&center);
      poVar4 = std::operator<<((ostream *)(h + 0x10),"<META http-equiv=\'refresh\' content=2;URL=\'"
                              );
      poVar4 = std::operator<<(poVar4,"/session");
      HttpMessage::getParameterString_abi_cxx11_((string *)&center,&copy);
      poVar4 = std::operator<<(poVar4,(string *)&center);
      std::operator<<(poVar4,"\'>");
      std::__cxx11::string::~string((string *)&center);
      poVar4 = (ostream *)(b + 0x10);
      HTML::CENTER::CENTER(&center,poVar4);
      HTML::TAG::text(&center.super_TAG);
      HTML::H2::H2(&h2,poVar4);
      HTML::TAG::text(&h2.super_TAG);
      HTML::A::A(&a,poVar4);
      HttpMessage::getParameterString_abi_cxx11_(&local_7e8,&copy);
      std::operator+(&bStack_808,"/session",&local_7e8);
      pTVar5 = &HTML::A::href(&a,&bStack_808)->super_TAG;
      std::__cxx11::string::string((string *)&local_7c8,(string *)&sessionID.m_frozenString);
      HTML::TAG::text(pTVar5,&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::__cxx11::string::~string((string *)&bStack_808);
      std::__cxx11::string::~string((string *)&local_7e8);
      HTML::TAG::~TAG(&a.super_TAG);
      std::operator<<(poVar4," has been refreshed");
      HTML::TAG::~TAG(&h2.super_TAG);
      goto LAB_0018929a;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&center);
  }
  poVar4 = (ostream *)(b + 0x10);
  HTML::CENTER::CENTER(&center,poVar4);
  HTML::TAG::text(&center.super_TAG);
  HTML::H2::H2(&h2,poVar4);
  HTML::TAG::text(&h2.super_TAG);
  std::operator<<(poVar4,"Are you sure you want to refresh session ");
  HTML::A::A(&a,poVar4);
  HttpMessage::getParameterString_abi_cxx11_(&local_7e8,request);
  std::operator+(&bStack_808,&sessionUrl,&local_7e8);
  pTVar5 = &HTML::A::href(&a,&bStack_808)->super_TAG;
  std::__cxx11::string::string((string *)&local_7c8,(string *)&sessionID.m_frozenString);
  HTML::TAG::text(pTVar5,&local_7c8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&bStack_808);
  std::__cxx11::string::~string((string *)&local_7e8);
  HTML::TAG::~TAG(&a.super_TAG);
  std::operator<<(poVar4,"?");
  HTML::TAG::~TAG(&h2.super_TAG);
  HTML::TAG::~TAG(&center.super_TAG);
  HTML::CENTER::CENTER(&center,poVar4);
  HTML::TAG::text(&center.super_TAG);
  std::operator<<(poVar4,"[");
  HTML::A::A((A *)&h2,poVar4);
  HttpMessage::toString_abi_cxx11_(&bStack_808,request);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&a,&bStack_808
                 ,"&confirm=1");
  pTVar5 = &HTML::A::href((A *)&h2,(string *)&a)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7e8,"YES, refresh session",(allocator<char> *)&local_7c8);
  HTML::TAG::text(pTVar5,&local_7e8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&bStack_808);
  HTML::TAG::~TAG(&h2.super_TAG);
  poVar6 = std::operator<<(poVar4,"]");
  poVar6 = std::operator<<(poVar6,HTML::NBSP);
  std::operator<<(poVar6,"[");
  HTML::A::A((A *)&h2,poVar4);
  pTVar5 = &HTML::A::href((A *)&h2,&sessionUrl)->super_TAG;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"NO, do not refresh session",(allocator<char> *)&bStack_808);
  HTML::TAG::text(pTVar5,(string *)&a);
  std::__cxx11::string::~string((string *)&a);
  HTML::TAG::~TAG(&h2.super_TAG);
  std::operator<<(poVar4,"]");
LAB_0018929a:
  HTML::TAG::~TAG(&center.super_TAG);
  std::__cxx11::string::~string((string *)&sessionUrl);
  SessionID::~SessionID(&sessionID);
  std::__cxx11::string::~string((string *)&sessionQualifier);
  std::__cxx11::string::~string((string *)&targetCompID);
  std::__cxx11::string::~string((string *)&senderCompID);
  std::__cxx11::string::~string((string *)&beginString);
  HttpMessage::~HttpMessage(&copy);
  return;
}

Assistant:

void HttpConnection::processRefreshSession
( const HttpMessage& request, std::stringstream& h, std::stringstream& b )
{
  try
  {
    HttpMessage copy = request;
    std::string beginString = request.getParameter( "BeginString" );
    std::string senderCompID = request.getParameter( "SenderCompID" );
    std::string targetCompID = request.getParameter( "TargetCompID" );
    std::string sessionQualifier;
    if( copy.hasParameter("SessionQualifier") )
    sessionQualifier = copy.getParameter( "SessionQualifier" );

    SessionID sessionID( beginString, senderCompID, targetCompID, sessionQualifier );
    Session* pSession = Session::lookupSession( sessionID );
    if( pSession == 0 ) throw SessionNotFound();

    std::string sessionUrl = "/session" + request.getParameterString();

    bool confirm = false;
    if( copy.hasParameter("confirm") && copy.getParameter("confirm") != "0" )
    {
      confirm = true;
      pSession->refresh();
      copy.removeParameter("confirm");
    }

    if( confirm )
    {
      h << "<META http-equiv='refresh' content=2;URL='" << "/session" << copy.getParameterString() << "'>";
      CENTER center(b); center.text();
      H2 h2(b); h2.text();
      { A a(b); a.href("/session" + copy.getParameterString()).text(sessionID.toString()); }
      b << " has been refreshed";
    }
    else
    {
      { CENTER center(b); center.text();
        H2 h2(b); h2.text();
        b << "Are you sure you want to refresh session ";
        { A a(b); a.href(sessionUrl + request.getParameterString()).text(sessionID.toString()); }
        b << "?";
      }
      { CENTER center(b); center.text();
        b << "[";
        { A a(b); a.href(request.toString() + "&confirm=1").text("YES, refresh session"); }
        b << "]" << NBSP << "[";
        { A a(b); a.href(sessionUrl).text("NO, do not refresh session"); }
        b << "]";
      }
    }
  }
  catch( std::exception& e )
  {
    b << e.what();
  }
}